

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O2

void __thiscall QFbVtHandler::QFbVtHandler(QFbVtHandler *this,QObject *parent)

{
  int iVar1;
  QSocketNotifier *this_00;
  int *piVar2;
  long in_FS_OFFSET;
  Object local_c0 [8];
  sigaction local_b8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,parent);
  *(undefined ***)this = &PTR_metaObject_001455e8;
  *(undefined4 *)(this + 0x10) = 0xffffffff;
  *(undefined8 *)(this + 0x20) = 0;
  iVar1 = isatty(0);
  if (iVar1 != 0) {
    *(undefined4 *)(this + 0x10) = 0;
  }
  iVar1 = socketpair(1,1,0,(int *)(this + 0x18));
  if (iVar1 == 0) {
    vth = (QFbVtHandler *)this;
    setTTYCursor(false);
    setKeyboardEnabled(this,false);
    this_00 = (QSocketNotifier *)operator_new(0x10);
    QSocketNotifier::QSocketNotifier(this_00,(long)*(int *)(this + 0x1c),Read,(QObject *)this);
    *(QSocketNotifier **)(this + 0x20) = this_00;
    local_b8.__sigaction_handler.sa_handler = handleSignal;
    local_b8.sa_mask.__val[0] = 0;
    QObject::
    connect<void(QSocketNotifier::*)(QSocketDescriptor,QSocketNotifier::Type,QSocketNotifier::QPrivateSignal),void(QFbVtHandler::*)()>
              (local_c0,(offset_in_QSocketNotifier_to_subr)this_00,
               (ContextType *)QSocketNotifier::activated,(offset_in_QFbVtHandler_to_subr *)0x0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_c0);
    iVar1 = qEnvironmentVariableIntValue("QT_QPA_NO_SIGNAL_HANDLER",(bool *)0x0);
    if (iVar1 == 0) {
      memset(&local_b8.sa_mask,0xaa,0x90);
      local_b8.sa_flags = 0;
      local_b8.__sigaction_handler.sa_handler = signalHandler;
      sigemptyset(&local_b8.sa_mask);
      sigaction(2,&local_b8,(sigaction *)0x0);
      sigaction(0x14,&local_b8,(sigaction *)0x0);
      sigaction(0x12,&local_b8,(sigaction *)0x0);
      sigaction(0xf,&local_b8,(sigaction *)0x0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    piVar2 = __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      qErrnoWarning(*piVar2,"QFbVtHandler: socketpair() failed");
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

QFbVtHandler::QFbVtHandler(QObject *parent)
    : QObject(parent),
      m_tty(-1),
      m_signalNotifier(0)
{
#ifdef VTH_ENABLED
    if (isatty(0))
        m_tty = 0;

    if (::socketpair(AF_UNIX, SOCK_STREAM, 0, m_sigFd)) {
        qErrnoWarning(errno, "QFbVtHandler: socketpair() failed");
        return;
    }

    vth = this;
    setTTYCursor(false);
    setKeyboardEnabled(false);

    m_signalNotifier = new QSocketNotifier(m_sigFd[1], QSocketNotifier::Read, this);
    connect(m_signalNotifier, &QSocketNotifier::activated, this, &QFbVtHandler::handleSignal);

    if (!qEnvironmentVariableIntValue("QT_QPA_NO_SIGNAL_HANDLER")) {
        struct sigaction sa;
        sa.sa_flags = 0;
        sa.sa_handler = signalHandler;
        sigemptyset(&sa.sa_mask);
        sigaction(SIGINT, &sa, 0); // Ctrl+C
        sigaction(SIGTSTP, &sa, 0); // Ctrl+Z
        sigaction(SIGCONT, &sa, 0);
        sigaction(SIGTERM, &sa, 0); // default signal used by kill
    }
#endif
}